

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaLiteTest_Parsing_Test::TestBody
          (Proto3ArenaLiteTest_Parsing_Test *this)

{
  TestAllTypes *this_00;
  string local_438;
  string_view local_418;
  TestAllTypes *local_408;
  TestAllTypes *arena_message;
  Arena arena;
  undefined1 local_348 [8];
  TestAllTypes original;
  Proto3ArenaLiteTest_Parsing_Test *this_local;
  
  original.field_0._800_8_ = this;
  proto3_arena_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_348);
  SetAllFields((TestAllTypes *)local_348);
  Arena::Arena((Arena *)&arena_message);
  this_00 = Arena::Create<proto3_arena_unittest::TestAllTypes>((Arena *)&arena_message);
  local_408 = this_00;
  protobuf::MessageLite::SerializeAsString_abi_cxx11_(&local_438,(MessageLite *)local_348);
  local_418 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_438);
  protobuf::MessageLite::ParseFromString((MessageLite *)this_00,local_418);
  std::__cxx11::string::~string((string *)&local_438);
  ExpectAllFieldsSet(local_408);
  Arena::~Arena((Arena *)&arena_message);
  proto3_arena_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_348);
  return;
}

Assistant:

TEST(Proto3ArenaLiteTest, Parsing) {
  TestAllTypes original;
  SetAllFields(&original);

  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->ParseFromString(original.SerializeAsString());
  ExpectAllFieldsSet(*arena_message);
}